

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::_free(Tree *this)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  Location LVar4;
  bool bVar5;
  size_t sVar6;
  NodeData *pNVar7;
  char *pcVar8;
  csubstr cVar9;
  char *pcStack_70;
  size_t local_68;
  char *pcStack_48;
  size_t local_40;
  char msg [26];
  
  pNVar7 = this->m_buf;
  if (pNVar7 != (NodeData *)0x0) {
    sVar6 = this->m_cap;
    if (sVar6 == 0) {
      builtin_strncpy(msg + 0x10,"_cap > 0)",10);
      builtin_strncpy(msg,"check failed: (m",0x10);
      if (((byte)s_error_flags & 1) != 0) {
        bVar5 = is_debugger_attached();
        if (bVar5) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
      }
      p_Var1 = (this->m_callbacks).m_error;
      cVar9 = to_csubstr(
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                        );
      local_40 = cVar9.len;
      pcStack_48 = cVar9.str;
      LVar3.super_LineCol.col = 0;
      LVar3.super_LineCol.offset = SUB168(ZEXT816(0x62c0) << 0x40,0);
      LVar3.super_LineCol.line = SUB168(ZEXT816(0x62c0) << 0x40,8);
      LVar3.name.str = pcStack_48;
      LVar3.name.len = local_40;
      (*p_Var1)(msg,0x1a,LVar3,(this->m_callbacks).m_user_data);
      pNVar7 = this->m_buf;
      sVar6 = this->m_cap;
    }
    (*(this->m_callbacks).m_free)(pNVar7,sVar6 * 0x90,(this->m_callbacks).m_user_data);
    this->m_buf = (NodeData *)0x0;
  }
  pcVar8 = (this->m_arena).str;
  if (pcVar8 != (char *)0x0) {
    sVar6 = (this->m_arena).len;
    if (sVar6 == 0) {
      builtin_strncpy(msg + 0x10,"_arena.len",10);
      builtin_strncpy(msg,"check failed: (m",0x10);
      if (((byte)s_error_flags & 1) != 0) {
        bVar5 = is_debugger_attached();
        if (bVar5) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
      }
      p_Var1 = (this->m_callbacks).m_error;
      cVar9 = to_csubstr(
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                        );
      local_68 = cVar9.len;
      pcStack_70 = cVar9.str;
      LVar4.super_LineCol.col = 0;
      LVar4.super_LineCol.offset = SUB168(ZEXT816(0x62c5) << 0x40,0);
      LVar4.super_LineCol.line = SUB168(ZEXT816(0x62c5) << 0x40,8);
      LVar4.name.str = pcStack_70;
      LVar4.name.len = local_68;
      (*p_Var1)(msg,0x20,LVar4,(this->m_callbacks).m_user_data);
      pcVar8 = (this->m_arena).str;
      sVar6 = (this->m_arena).len;
    }
    (*(this->m_callbacks).m_free)(pcVar8,sVar6,(this->m_callbacks).m_user_data);
    (this->m_arena).str = (char *)0x0;
  }
  _clear(this);
  return;
}

Assistant:

void Tree::_free()
{
    if(m_buf)
    {
        _RYML_CB_ASSERT(m_callbacks, m_cap > 0);
        _RYML_CB_FREE(m_callbacks, m_buf, NodeData, m_cap);
    }
    if(m_arena.str)
    {
        _RYML_CB_ASSERT(m_callbacks, m_arena.len > 0);
        _RYML_CB_FREE(m_callbacks, m_arena.str, char, m_arena.len);
    }
    _clear();
}